

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

lys_node * moveto_snode_get_root(lys_node *cur_node,int options,lyxp_node_type *root_type)

{
  lys_node *plVar1;
  lys_module *module;
  
  if ((cur_node != (lys_node *)0x0) && (root_type != (lyxp_node_type *)0x0)) {
    if ((options & 4U) != 0) {
      while (plVar1 = lys_parent(cur_node), plVar1 != (lys_node *)0x0) {
        cur_node = lys_parent(cur_node);
      }
      plVar1 = lys_getnext((lys_node *)0x0,(lys_node *)0x0,cur_node->module,0);
      *root_type = LYXP_NODE_ROOT;
      return plVar1;
    }
    *root_type = cur_node->flags & LYXP_NODE_ROOT_CONFIG;
    while (plVar1 = lys_parent(cur_node), plVar1 != (lys_node *)0x0) {
      cur_node = lys_parent(cur_node);
    }
    module = lys_node_module(cur_node);
    plVar1 = lys_getnext((lys_node *)0x0,(lys_node *)0x0,module,0);
    return plVar1;
  }
  __assert_fail("cur_node && root_type",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                ,0x1092,
                "const struct lys_node *moveto_snode_get_root(const struct lys_node *, int, enum lyxp_node_type *)"
               );
}

Assistant:

static const struct lys_node *
moveto_snode_get_root(const struct lys_node *cur_node, int options, enum lyxp_node_type *root_type)
{
    const struct lys_node *root;

    assert(cur_node && root_type);

    if (options & LYXP_SNODE) {
        /* general root that can access everything */
        for (root = cur_node; lys_parent(root); root = lys_parent(root));
        root = lys_getnext(NULL, NULL, root->module, 0);
        *root_type = LYXP_NODE_ROOT;
        return root;
    }

    if (cur_node->flags & LYS_CONFIG_W) {
        *root_type = LYXP_NODE_ROOT_CONFIG;
    } else {
        *root_type = LYXP_NODE_ROOT;
    }

    for (root = cur_node; lys_parent(root); root = lys_parent(root));
    root = lys_getnext(NULL, NULL, lys_node_module(root), 0);

    return root;
}